

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACInfoWnd.cpp
# Opt level: O1

string * __thiscall ACIWnd::GetWndTitle_abi_cxx11_(string *__return_storage_ptr__,ACIWnd *this)

{
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  string _default;
  long *plVar4;
  size_type *psVar5;
  _Alloc_hider in_stack_ffffffffffffff98;
  size_type in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  long *local_48 [2];
  long local_38 [2];
  
  sVar1 = (this->acKey).key._M_string_length;
  if (sVar1 == 0) {
    in_stack_ffffffffffffff98._M_p = &stack0xffffffffffffffa8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffff98,"A/C Info","");
  }
  else {
    local_48[0] = local_38;
    pcVar2 = (this->acKey).key._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,pcVar2,pcVar2 + sVar1);
    _default._M_string_length = in_stack_ffffffffffffffa0;
    _default._M_dataplus._M_p = in_stack_ffffffffffffff98._M_p;
    _default.field_2._M_allocated_capacity = in_stack_ffffffffffffffa8;
    _default.field_2._8_8_ = in_stack_ffffffffffffffb0;
    LTFlightData::FDStaticData::acId((string *)&stack0xffffffffffffff98,&this->stat,_default);
  }
  plVar4 = (long *)std::__cxx11::string::append(&stack0xffffffffffffff98);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar3 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (in_stack_ffffffffffffff98._M_p != &stack0xffffffffffffffa8) {
    operator_delete(in_stack_ffffffffffffff98._M_p,in_stack_ffffffffffffffa8 + 1);
  }
  if ((sVar1 != 0) && (local_48[0] != local_38)) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ACIWnd::GetWndTitle () const
{
    return
    (acKey.empty() ? std::string(ACI_WND_TITLE) : stat.acId(std::string(acKey))) +
    (bAuto ? " (AUTO)" : "");
}